

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::OutputLine(cmRST *this,string *line_in,bool inlineMarkup)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pcVar7;
  bool bVar8;
  string local_1c8 [39];
  char local_1a1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1a0;
  char c;
  iterator __end6;
  iterator __begin6;
  string *__range6;
  undefined1 local_180 [7];
  bool escaped;
  string text_2;
  undefined1 local_140 [8];
  string text_1;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  string text;
  size_type local_68;
  size_type lit_start;
  size_type link_start;
  size_type role_start;
  size_type *first;
  size_type pos;
  string line;
  bool inlineMarkup_local;
  string *line_in_local;
  cmRST *this_local;
  
  line.field_2._M_local_buf[0xf] = inlineMarkup;
  if ((this->OutputLinePending & 1U) != 0) {
    std::operator<<(this->OS,"\n");
    this->OutputLinePending = false;
  }
  if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
    poVar5 = std::operator<<(this->OS,(string *)line_in);
    std::operator<<(poVar5,"\n");
  }
  else {
    ReplaceSubstitutions((string *)&pos,this,line_in);
    first = (size_type *)0x0;
    while( true ) {
      while( true ) {
        while( true ) {
          role_start = 0;
          link_start = 0xffffffffffffffff;
          lit_start = 0xffffffffffffffff;
          local_68 = 0xffffffffffffffff;
          lVar4 = std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find(&this->CMakeRole,(char *)(lVar4 + (long)first));
          if (bVar1) {
            link_start = cmsys::RegularExpression::start(&this->CMakeRole);
            role_start = (size_type)&link_start;
          }
          lVar4 = std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find(&this->InlineLiteral,(char *)(lVar4 + (long)first))
          ;
          if ((bVar1) &&
             ((local_68 = cmsys::RegularExpression::start(&this->InlineLiteral), role_start == 0 ||
              (local_68 < *(ulong *)role_start)))) {
            role_start = (size_type)&local_68;
          }
          lVar4 = std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find(&this->InlineLink,(char *)(lVar4 + (long)first));
          if ((bVar1) &&
             ((lit_start = cmsys::RegularExpression::start(&this->InlineLink), role_start == 0 ||
              (lit_start < *(ulong *)role_start)))) {
            role_start = (size_type)&lit_start;
          }
          if ((size_type *)role_start != &link_start) break;
          poVar5 = this->OS;
          std::__cxx11::string::substr((ulong)((long)&text.field_2 + 8),(ulong)&pos);
          std::operator<<(poVar5,(string *)(text.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(text.field_2._M_local_buf + 8));
          cmsys::RegularExpression::match_abi_cxx11_((string *)local_b8,&this->CMakeRole,3);
          bVar1 = false;
          cmsys::RegularExpression::match_abi_cxx11_(&local_d8,&this->CMakeRole,2);
          bVar2 = std::operator==(&local_d8,"command");
          bVar8 = false;
          if (bVar2) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_f8,&this->CMakeRole,5);
            bVar1 = true;
            uVar3 = std::__cxx11::string::empty();
            bVar8 = false;
            if ((uVar3 & 1) != 0) {
              lVar4 = std::__cxx11::string::find_first_of(local_b8,0x74ffdc);
              bVar8 = lVar4 == -1;
            }
          }
          if (bVar1) {
            std::__cxx11::string::~string((string *)&local_f8);
          }
          std::__cxx11::string::~string((string *)&local_d8);
          if (bVar8) {
            std::__cxx11::string::operator+=((string *)local_b8,"()");
          }
          poVar5 = std::operator<<(this->OS,"``");
          poVar5 = std::operator<<(poVar5,(string *)local_b8);
          std::operator<<(poVar5,"``");
          sVar6 = cmsys::RegularExpression::end(&this->CMakeRole);
          first = (size_type *)(sVar6 + (long)first);
          std::__cxx11::string::~string((string *)local_b8);
        }
        if ((size_type *)role_start != &local_68) break;
        poVar5 = this->OS;
        std::__cxx11::string::substr((ulong)((long)&text_1.field_2 + 8),(ulong)&pos);
        std::operator<<(poVar5,(string *)(text_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(text_1.field_2._M_local_buf + 8));
        cmsys::RegularExpression::match_abi_cxx11_((string *)local_140,&this->InlineLiteral,1);
        sVar6 = cmsys::RegularExpression::end(&this->InlineLiteral);
        first = (size_type *)((long)first + sVar6);
        poVar5 = std::operator<<(this->OS,"``");
        poVar5 = std::operator<<(poVar5,(string *)local_140);
        std::operator<<(poVar5,"``");
        std::__cxx11::string::~string((string *)local_140);
      }
      if ((size_type *)role_start != &lit_start) break;
      poVar5 = this->OS;
      std::__cxx11::string::substr((ulong)((long)&text_2.field_2 + 8),(ulong)&pos);
      std::operator<<(poVar5,(string *)(text_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(text_2.field_2._M_local_buf + 8));
      cmsys::RegularExpression::match_abi_cxx11_((string *)local_180,&this->InlineLink,1);
      bVar1 = false;
      __end6._M_current = (char *)std::__cxx11::string::begin();
      _Stack_1a0._M_current = (char *)std::__cxx11::string::end();
      while (bVar8 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffe60), bVar8) {
        pcVar7 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end6);
        local_1a1 = *pcVar7;
        if (bVar1) {
          bVar1 = false;
          std::operator<<(this->OS,local_1a1);
        }
        else if (local_1a1 == '\\') {
          bVar1 = true;
        }
        else {
          std::operator<<(this->OS,local_1a1);
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end6);
      }
      sVar6 = cmsys::RegularExpression::end(&this->InlineLink);
      first = (size_type *)(sVar6 + (long)first);
      std::__cxx11::string::~string((string *)local_180);
    }
    poVar5 = this->OS;
    std::__cxx11::string::substr((ulong)local_1c8,(ulong)&pos);
    poVar5 = std::operator<<(poVar5,local_1c8);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string((string *)&pos);
  }
  return;
}

Assistant:

void cmRST::OutputLine(std::string const& line_in, bool inlineMarkup)
{
  if (this->OutputLinePending) {
    this->OS << "\n";
    this->OutputLinePending = false;
  }
  if (inlineMarkup) {
    std::string line = this->ReplaceSubstitutions(line_in);
    std::string::size_type pos = 0;
    for (;;) {
      std::string::size_type* first = nullptr;
      std::string::size_type role_start = std::string::npos;
      std::string::size_type link_start = std::string::npos;
      std::string::size_type lit_start = std::string::npos;
      if (this->CMakeRole.find(line.c_str() + pos)) {
        role_start = this->CMakeRole.start();
        first = &role_start;
      }
      if (this->InlineLiteral.find(line.c_str() + pos)) {
        lit_start = this->InlineLiteral.start();
        if (!first || lit_start < *first) {
          first = &lit_start;
        }
      }
      if (this->InlineLink.find(line.c_str() + pos)) {
        link_start = this->InlineLink.start();
        if (!first || link_start < *first) {
          first = &link_start;
        }
      }
      if (first == &role_start) {
        this->OS << line.substr(pos, role_start);
        std::string text = this->CMakeRole.match(3);
        // If a command reference has no explicit target and
        // no explicit "(...)" then add "()" to the text.
        if (this->CMakeRole.match(2) == "command" &&
            this->CMakeRole.match(5).empty() &&
            text.find_first_of("()") == std::string::npos) {
          text += "()";
        }
        this->OS << "``" << text << "``";
        pos += this->CMakeRole.end();
      } else if (first == &lit_start) {
        this->OS << line.substr(pos, lit_start);
        std::string text = this->InlineLiteral.match(1);
        pos += this->InlineLiteral.end();
        this->OS << "``" << text << "``";
      } else if (first == &link_start) {
        this->OS << line.substr(pos, link_start);
        std::string text = this->InlineLink.match(1);
        bool escaped = false;
        for (char c : text) {
          if (escaped) {
            escaped = false;
            this->OS << c;
          } else if (c == '\\') {
            escaped = true;
          } else {
            this->OS << c;
          }
        }
        pos += this->InlineLink.end();
      } else {
        break;
      }
    }
    this->OS << line.substr(pos) << "\n";
  } else {
    this->OS << line_in << "\n";
  }
}